

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqobject.cpp
# Opt level: O0

bool __thiscall SQGenerator::Resume(SQGenerator *this,SQVM *v,SQObjectPtr *dest)

{
  SQObjectPtr *pSVar1;
  bool bVar2;
  SQVM *this_00;
  long lVar3;
  long in_RDX;
  SQVM *in_RSI;
  SQGenerator *in_RDI;
  SQInteger in_stack_00000010;
  SQInteger in_stack_00000018;
  SQVM *in_stack_00000020;
  SQInteger n;
  SQObject _this;
  SQExceptionTrap *et;
  SQInteger i;
  SQInteger newbase;
  SQInteger target;
  SQInteger size;
  SQObject *this_01;
  SQExceptionTrap *in_stack_ffffffffffffff88;
  SQObject *obj;
  sqvector<SQExceptionTrap> *in_stack_ffffffffffffff90;
  long local_60;
  SQObject local_58;
  SQExceptionTrap *local_48;
  undefined8 in_stack_ffffffffffffffc0;
  undefined1 tailcall;
  SQInteger newtop;
  bool local_1;
  
  tailcall = (undefined1)((ulong)in_stack_ffffffffffffffc0 >> 0x38);
  if (in_RDI->_state == eDead) {
    SQVM::Raise_Error(in_RSI,"resuming dead generator");
    local_1 = false;
  }
  else if (in_RDI->_state == eRunning) {
    SQVM::Raise_Error(in_RSI,"resuming active generator");
    local_1 = false;
  }
  else {
    this_00 = (SQVM *)sqvector<SQObjectPtr>::size(&in_RDI->_stack);
    lVar3 = in_RDX - (long)((in_RSI->_stack)._vals + in_RSI->_stackbase) >> 4;
    newtop = in_RSI->_top;
    bVar2 = SQVM::EnterFrame(this_00,lVar3,newtop,(bool)tailcall);
    if (bVar2) {
      in_RSI->ci->_generator = in_RDI;
      in_RSI->ci->_target = (SQInt32)lVar3;
      ::SQObjectPtr::operator=
                ((SQObjectPtr *)in_stack_ffffffffffffff90,(SQObjectPtr *)in_stack_ffffffffffffff88);
      in_RSI->ci->_ip = (in_RDI->_ci)._ip;
      in_RSI->ci->_literals = (in_RDI->_ci)._literals;
      in_RSI->ci->_ncalls = (in_RDI->_ci)._ncalls;
      in_RSI->ci->_etraps = (in_RDI->_ci)._etraps;
      in_RSI->ci->_root = (in_RDI->_ci)._root;
      for (lVar3 = 0; lVar3 < (in_RDI->_ci)._etraps; lVar3 = lVar3 + 1) {
        in_stack_ffffffffffffff90 = &in_RSI->_etraps;
        sqvector<SQExceptionTrap>::top(&in_RDI->_etraps);
        sqvector<SQExceptionTrap>::push_back(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
        sqvector<SQExceptionTrap>::pop_back(&in_RDI->_etraps);
        local_48 = sqvector<SQExceptionTrap>::back(&in_RSI->_etraps);
        local_48->_stackbase = newtop + local_48->_stackbase;
        local_48->_stacksize = newtop + local_48->_stacksize;
      }
      pSVar1 = (in_RDI->_stack)._vals;
      local_58._type = (pSVar1->super_SQObject)._type;
      local_58._4_4_ = *(undefined4 *)&(pSVar1->super_SQObject).field_0x4;
      local_58._unVal = (SQObjectValue)(pSVar1->super_SQObject)._unVal.pWeakRef;
      if (local_58._type == OT_WEAKREF) {
        this_01 = &(local_58._unVal.pWeakRef)->_obj;
      }
      else {
        this_01 = &local_58;
      }
      obj = this_01;
      sqvector<SQObjectPtr>::operator[](&in_RSI->_stack,in_RSI->_stackbase);
      ::SQObjectPtr::operator=((SQObjectPtr *)in_stack_ffffffffffffff90,obj);
      for (local_60 = 1; local_60 < (long)this_00; local_60 = local_60 + 1) {
        sqvector<SQObjectPtr>::operator[](&in_RSI->_stack,in_RSI->_stackbase + local_60);
        ::SQObjectPtr::operator=((SQObjectPtr *)in_stack_ffffffffffffff90,(SQObjectPtr *)obj);
        ::SQObjectPtr::Null((SQObjectPtr *)this_01);
      }
      in_RDI->_state = eRunning;
      if ((in_RSI->_debughook & 1U) != 0) {
        SQVM::CallDebugHook(in_stack_00000020,in_stack_00000018,in_stack_00000010);
      }
      local_1 = true;
    }
    else {
      local_1 = false;
    }
  }
  return local_1;
}

Assistant:

bool SQGenerator::Resume(SQVM *v,SQObjectPtr &dest)
{
    if(_state==eDead){ v->Raise_Error(_SC("resuming dead generator")); return false; }
    if(_state==eRunning){ v->Raise_Error(_SC("resuming active generator")); return false; }
    SQInteger size = _stack.size();
    SQInteger target = &dest - &(v->_stack._vals[v->_stackbase]);
    assert(target>=0 && target<=255);
    SQInteger newbase = v->_top;
    if(!v->EnterFrame(v->_top, v->_top + size, false))
        return false;
    v->ci->_generator   = this;
    v->ci->_target      = (SQInt32)target;
    v->ci->_closure     = _ci._closure;
    v->ci->_ip          = _ci._ip;
    v->ci->_literals    = _ci._literals;
    v->ci->_ncalls      = _ci._ncalls;
    v->ci->_etraps      = _ci._etraps;
    v->ci->_root        = _ci._root;


    for(SQInteger i=0;i<_ci._etraps;i++) {
        v->_etraps.push_back(_etraps.top());
        _etraps.pop_back();
        SQExceptionTrap &et = v->_etraps.back();
        // restore absolute stack base and size
        et._stackbase += newbase;
        et._stacksize += newbase;
    }
    SQObject _this = _stack._vals[0];
    v->_stack[v->_stackbase] = type(_this) == OT_WEAKREF ? _weakref(_this)->_obj : _this;

    for(SQInteger n = 1; n<size; n++) {
        v->_stack[v->_stackbase+n] = _stack._vals[n];
        _stack._vals[n].Null();
    }

    _state=eRunning;
    if (v->_debughook)
        v->CallDebugHook(_SC('c'));

    return true;
}